

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O0

string * __thiscall
t_st_generator::a_type_abi_cxx11_(string *__return_storage_ptr__,t_st_generator *this,t_type *type)

{
  bool bVar1;
  char *pcVar2;
  string local_b0;
  string local_90;
  string local_60;
  undefined1 local_40 [8];
  string prefix;
  t_type *type_local;
  t_st_generator *this_local;
  
  prefix.field_2._8_8_ = type;
  std::__cxx11::string::string((string *)local_40);
  type_name_abi_cxx11_(&local_60,this,(t_type *)prefix.field_2._8_8_);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&local_60);
  bVar1 = is_vowel(this,*pcVar2);
  std::__cxx11::string::~string((string *)&local_60);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)local_40,"an");
  }
  else {
    std::__cxx11::string::operator=((string *)local_40,"a");
  }
  type_name_abi_cxx11_(&local_b0,this,(t_type *)prefix.field_2._8_8_);
  t_generator::capitalize(&local_90,(t_generator *)this,&local_b0);
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::a_type(t_type* type) {
  string prefix;

  if (is_vowel(type_name(type)[0]))
    prefix = "an";
  else
    prefix = "a";

  return prefix + capitalize(type_name(type));
}